

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_operator_expression.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundOperatorExpression::Copy(BoundOperatorExpression *this)

{
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar1;
  pointer pBVar2;
  pointer pEVar3;
  Expression *in_RSI;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_00;
  _Head_base<0UL,_duckdb::BoundOperatorExpression_*,_false> local_40;
  __uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> local_38;
  
  make_uniq<duckdb::BoundOperatorExpression,duckdb::ExpressionType_const&,duckdb::LogicalType_const&>
            ((duckdb *)&local_40,&(in_RSI->super_BaseExpression).type,&in_RSI->return_type);
  pBVar2 = unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
                         *)&local_40);
  Expression::CopyProperties(&pBVar2->super_Expression,in_RSI);
  puVar1 = *(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> **)
            &in_RSI[1].super_BaseExpression.type;
  for (this_00 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_RSI[1].super_BaseExpression._vptr_BaseExpression; this_00 != puVar1;
      this_00 = this_00 + 1) {
    pBVar2 = unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
             ::operator->((unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
                           *)&local_40);
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_00);
    (*(pEVar3->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_38,pEVar3);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&pBVar2->children,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_38);
    if (local_38._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0) {
      (**(code **)(*(long *)local_38._M_t.
                            super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                            .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 8))()
      ;
    }
  }
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_40._M_head_impl;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundOperatorExpression::Copy() const {
	auto copy = make_uniq<BoundOperatorExpression>(type, return_type);
	copy->CopyProperties(*this);
	for (auto &child : children) {
		copy->children.push_back(child->Copy());
	}
	return std::move(copy);
}